

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTBITDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t l;
  octet *v;
  
  sVar2 = derDec2(&v,&l,der,count,tag);
  sVar3 = 0xffffffffffffffff;
  if ((sVar2 != 0xffffffffffffffff) && (l != 0)) {
    bVar1 = *v;
    if ((((ulong)bVar1 < 8) && (((l != 1 || (bVar1 == 0)) && (l * 8 + -8 == bVar1 + len)))) &&
       (sVar3 = sVar2, val != (octet *)0x0)) {
      memMove(val,v + 1,l - 1);
    }
  }
  return sVar3;
}

Assistant:

size_t derTBITDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	// длина не соответствует ожидаемой?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1 || (l - 1) * 8 != len + v[0])
		return SIZE_MAX;
	// возвратить строку
	if (val)
		memMove(val, v + 1, l - 1);
	return count;
}